

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

PassToken __thiscall
spvtools::CreateAggressiveDCEPass(spvtools *this,bool preserve_interface,bool remove_outputs)

{
  AggressiveDCEPass *this_00;
  undefined8 *puVar1;
  __uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_28;
  
  this_00 = (AggressiveDCEPass *)operator_new(0x210);
  opt::AggressiveDCEPass::AggressiveDCEPass(this_00,preserve_interface,remove_outputs);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this_00;
  *(undefined8 **)this = puVar1;
  local_28._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (tuple<spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(_Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )0x0;
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr((unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
                 *)&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateAggressiveDCEPass(bool preserve_interface,
                                             bool remove_outputs) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::AggressiveDCEPass>(preserve_interface, remove_outputs));
}